

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O1

void nn_aws_start(nn_aws *self,nn_usock *listener)

{
  if (self->state == 1) {
    self->listener = listener;
    (self->listener_owner).src = 3;
    (self->listener_owner).fsm = &self->fsm;
    nn_usock_swap_owner(listener,&self->listener_owner);
    nn_fsm_start(&self->fsm);
    return;
  }
  nn_aws_start_cold_1();
}

Assistant:

void nn_aws_start (struct nn_aws *self, struct nn_usock *listener)
{
    nn_assert_state (self, NN_AWS_STATE_IDLE);

    /*  Take ownership of the listener socket. */
    self->listener = listener;
    self->listener_owner.src = NN_AWS_SRC_LISTENER;
    self->listener_owner.fsm = &self->fsm;
    nn_usock_swap_owner (listener, &self->listener_owner);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}